

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O0

gme_err_t gme_open_file(char *path,Music_Emu **out,int sample_rate)

{
  int iVar1;
  undefined4 extraout_var;
  gme_type_t pgVar2;
  gme_type_t pgVar3;
  size_t in_RCX;
  int __oflag;
  undefined8 *in_RSI;
  char *in_RDI;
  gme_err_t err;
  Remaining_Reader rem;
  Music_Emu *emu;
  blargg_err_t blargg_return_err__1;
  gme_type_t file_type;
  int header_size;
  char header [4];
  blargg_err_t blargg_return_err_;
  Std_File_Reader in;
  Data_Reader *in_stack_ffffffffffffff28;
  Music_Emu *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined1 local_88 [32];
  Music_Emu *local_68;
  gme_type_t local_60;
  gme_type_t local_58;
  undefined4 local_50;
  undefined1 local_4c [4];
  undefined4 local_48;
  gme_type_t local_38;
  Std_File_Reader local_30;
  undefined8 *local_18;
  char *local_10;
  gme_type_t local_8;
  
  *in_RSI = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  Std_File_Reader::Std_File_Reader((Std_File_Reader *)in_stack_ffffffffffffff30);
  iVar1 = Std_File_Reader::open(&local_30,local_10,__oflag);
  pgVar3 = (gme_type_t)CONCAT44(extraout_var,iVar1);
  local_38 = pgVar3;
  if (pgVar3 == (gme_type_t)0x0) {
    local_50 = 0;
    pgVar2 = gme_identify_extension(in_stack_ffffffffffffff38);
    local_58 = pgVar2;
    if (pgVar2 == (gme_type_t)0x0) {
      local_50 = 4;
      local_60 = (gme_type_t)Std_File_Reader::read(&local_30,(int)local_4c,(void *)0x4,in_RCX);
      if (local_60 != (gme_type_t)0x0) {
        local_48 = 1;
        local_8 = local_60;
        goto LAB_007f90fe;
      }
      gme_identify_header(in_stack_ffffffffffffff28);
      local_58 = gme_identify_extension(in_stack_ffffffffffffff38);
    }
    if (local_58 == (gme_type_t)0x0) {
      local_8 = (gme_type_t)0x900077;
      local_48 = 1;
    }
    else {
      local_68 = gme_new_emu(pgVar3,(int)((ulong)pgVar2 >> 0x20));
      if (local_68 == (Music_Emu *)0x0) {
        local_8 = (gme_type_t)0x900059;
        local_48 = 1;
      }
      else {
        Remaining_Reader::Remaining_Reader
                  ((Remaining_Reader *)local_68,in_stack_ffffffffffffff38,
                   (long)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        iVar1 = (int)local_88;
        pgVar3 = (gme_type_t)
                 Gme_File::load(&in_stack_ffffffffffffff30->super_Gme_File,in_stack_ffffffffffffff28
                               );
        Std_File_Reader::close(&local_30,iVar1);
        if (pgVar3 == (gme_type_t)0x0) {
          *local_18 = local_68;
        }
        else {
          in_stack_ffffffffffffff30 = local_68;
          if (local_68 != (Music_Emu *)0x0) {
            (*(local_68->super_Gme_File)._vptr_Gme_File[1])();
          }
        }
        local_48 = 1;
        local_8 = pgVar3;
        Remaining_Reader::~Remaining_Reader((Remaining_Reader *)0x7f90fe);
      }
    }
  }
  else {
    local_48 = 1;
    local_8 = pgVar3;
  }
LAB_007f90fe:
  Std_File_Reader::~Std_File_Reader((Std_File_Reader *)in_stack_ffffffffffffff30);
  return (gme_err_t)local_8;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_open_file( const char* path, Music_Emu** out, int sample_rate )
{
	require( path && out );
	*out = 0;
	
	GME_FILE_READER in;
	RETURN_ERR( in.open( path ) );
	
	char header [4];
	int header_size = 0;
	
	gme_type_t file_type = gme_identify_extension( path );
	if ( !file_type )
	{
		header_size = sizeof header;
		RETURN_ERR( in.read( header, sizeof header ) );
		file_type = gme_identify_extension( gme_identify_header( header ) );
	}
	if ( !file_type )
		return gme_wrong_file_type;
	
	Music_Emu* emu = gme_new_emu( file_type, sample_rate );
	CHECK_ALLOC( emu );
	
	// optimization: avoids seeking/re-reading header
	Remaining_Reader rem( header, header_size, &in );
	gme_err_t err = emu->load( rem );
	in.close();
	
	if ( err )
		delete emu;
	else
		*out = emu;
	
	return err;
}